

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_http.hpp
# Opt level: O1

void __thiscall
SimpleWeb::
ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::
Session::Session(Session *this,size_t max_response_streambuf_size,
                shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
                *connection_,
                unique_ptr<asio::basic_streambuf<std::allocator<char>_>,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
                *request_streambuf_)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Response *this_00;
  
  (this->connection).
  super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (connection_->
            super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  (this->connection).
  super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (connection_->
           super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (connection_->
  super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
  )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->connection).
  super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  (connection_->
  super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = (element_type *)0x0;
  (this->request_streambuf)._M_t.
  super___uniq_ptr_impl<asio::basic_streambuf<std::allocator<char>_>,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_asio::basic_streambuf<std::allocator<char>_>_*,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
  .super__Head_base<0UL,_asio::basic_streambuf<std::allocator<char>_>_*,_false>._M_head_impl =
       (request_streambuf_->_M_t).
       super___uniq_ptr_impl<asio::basic_streambuf<std::allocator<char>_>,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_asio::basic_streambuf<std::allocator<char>_>_*,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
       .super__Head_base<0UL,_asio::basic_streambuf<std::allocator<char>_>_*,_false>._M_head_impl;
  (request_streambuf_->_M_t).
  super___uniq_ptr_impl<asio::basic_streambuf<std::allocator<char>_>,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_asio::basic_streambuf<std::allocator<char>_>_*,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
  .super__Head_base<0UL,_asio::basic_streambuf<std::allocator<char>_>_*,_false>._M_head_impl =
       (basic_streambuf<std::allocator<char>_> *)0x0;
  this_00 = (Response *)operator_new(0x1c0);
  Response::Response(this_00,max_response_streambuf_size,&this->connection);
  (this->response).
  super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>::Response*>
            (&(this->response).
              super___shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,this_00);
  (this->callback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callback).super__Function_base._M_functor + 8) = 0;
  return;
}

Assistant:

Session(std::size_t max_response_streambuf_size, std::shared_ptr<Connection> connection_, std::unique_ptr<asio::streambuf> request_streambuf_) noexcept
          : connection(std::move(connection_)), request_streambuf(std::move(request_streambuf_)), response(new Response(max_response_streambuf_size, connection)) {}